

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O2

Allocation * __thiscall
density::detail::
LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  __int_type _Var1;
  PinResult PVar2;
  LfQueueControl *i_atomic;
  LfQueueControl *pLVar3;
  void *pvVar4;
  uintptr_t uint_pointer;
  size_t i_alignment_00;
  LfQueueControl *pLVar5;
  ulong uVar6;
  unsigned_long *i_atomic_00;
  ulong uVar7;
  bool bVar8;
  PinGuard<density_tests::DeepTestAllocator<256UL>,_(density::progress_guarantee)0> scoped_pin;
  uintptr_t expected_next;
  
  if (7 < i_control_bits) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x80);
  }
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x81);
  }
  i_alignment_00 = 8;
  if (8 < i_alignment) {
    i_alignment_00 = i_alignment;
  }
  uVar7 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    uVar7 = i_size;
  }
  uVar6 = uVar7 + i_alignment_00 + (ulong)i_include_type * 8 + 0x3f;
  scoped_pin.m_pinned_page = (void *)0x0;
  scoped_pin.m_allocator = (DeepTestAllocator<256UL> *)this;
  if (uVar6 < 0xc0) {
    pLVar3 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
LAB_010d22ea:
    do {
      i_atomic = pLVar3;
      if (((ulong)i_atomic & 0x3f) != 0) {
        i_atomic_00 = (unsigned_long *)((ulong)i_atomic & 0xffffffffffffffc0);
        PVar2 = PinGuard<density_tests::DeepTestAllocator<256UL>,_(density::progress_guarantee)0>::
                pin(&scoped_pin,i_atomic_00);
        if (PVar2 != AlreadyPinned) {
          if (PVar2 == PinFailed) {
            pvVar4 = (void *)0x0;
            goto LAB_010d23f1;
          }
          pLVar3 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
          if (pLVar3 != i_atomic) goto LAB_010d22ea;
        }
        expected_next = 0;
        pLVar5 = (LfQueueControl *)
                 ((ulong)(uint)((int)((ulong)i_atomic & 0x3f) << 6) + (long)i_atomic_00);
        raw_atomic_compare_exchange_weak<unsigned_long>
                  (i_atomic_00,&expected_next,(ulong)pLVar5 | 1,memory_order_seq_cst);
        LOCK();
        pLVar3 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar8 = i_atomic == pLVar3;
        if (bVar8) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar5;
          pLVar3 = i_atomic;
        }
        UNLOCK();
        if (bVar8) {
          pLVar3 = pLVar5;
        }
        goto LAB_010d22ea;
      }
      _Var1 = (long)&i_atomic->m_next + (ulong)((uint)uVar6 & 0xc0);
      if (0xc0 < _Var1 - ((ulong)i_atomic & 0xffffffffffffff00)) {
        pLVar3 = (LfQueueControl *)page_overflow(this,LfQueue_Throwing,(uintptr_t)i_atomic);
        goto LAB_010d22ea;
      }
      uVar7 = (ulong)i_atomic | uVar6 >> 6;
      LOCK();
      pLVar3 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
      bVar8 = i_atomic == pLVar3;
      if (bVar8) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar7;
        pLVar3 = i_atomic;
      }
      UNLOCK();
    } while (!bVar8);
    raw_atomic_store(&i_atomic->m_next,i_control_bits + _Var1,memory_order_seq_cst);
    LOCK();
    if (uVar7 == (this->m_tail).super___atomic_base<unsigned_long>._M_i) {
      (this->m_tail).super___atomic_base<unsigned_long>._M_i = _Var1;
    }
    UNLOCK();
    pvVar4 = address_upper_align((void *)((ulong)i_include_type * 8 + 8 | (ulong)i_atomic),
                                 i_alignment_00);
    __return_storage_ptr__->m_control_block = i_atomic;
    __return_storage_ptr__->m_next_ptr = i_control_bits + _Var1;
LAB_010d23f1:
    __return_storage_ptr__->m_user_storage = pvVar4;
  }
  else {
    LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    ::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
              (__return_storage_ptr__,
               &this->
                super_LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
               ,i_control_bits,uVar7,i_alignment_00);
  }
  PinGuard<density_tests::DeepTestAllocator<256UL>,_(density::progress_guarantee)0>::~PinGuard
            (&scoped_pin);
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                auto const overhead = i_include_type ? s_element_min_offset : s_rawblock_min_offset;
                auto const required_size = overhead + i_size + (i_alignment - min_alignment);
                auto const required_units =
                  (required_size + (s_alloc_granularity - 1)) / s_alloc_granularity;

                // instantiate a pin-guard - we will use it only in case of contention
                PinGuard<ALLOCATOR_TYPE, ToDenGuarantee(PROGRESS_GUARANTEE)> scoped_pin(this);

                bool const fits_in_page =
                  required_units <
                  size_min(s_alloc_granularity, s_end_control_offset / s_alloc_granularity);
                if (fits_in_page)
                {
                    auto tail = m_tail.load(mem_relaxed);
                    for (;;)
                    {
                        static_assert(is_power_of_2(s_alloc_granularity), "");
                        auto const rest = tail & (s_alloc_granularity - 1);
                        if (rest == 0)
                        {
                            // we can try the allocation
                            auto const new_control = reinterpret_cast<ControlBlock *>(tail);
                            auto const future_tail = tail + required_units * s_alloc_granularity;
                            auto const page_start =
                              uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                            auto const future_tail_offset = future_tail - page_start;
                            auto       transient_tail     = tail + required_units;
                            if (DENSITY_LIKELY(future_tail_offset <= s_end_control_offset))
                            {
                                DENSITY_ASSUME(required_units < s_alloc_granularity);
                                if (m_tail.compare_exchange_weak(tail, transient_tail, mem_relaxed))
                                {
                                    raw_atomic_store(
                                      &new_control->m_next,
                                      future_tail + i_control_bits,
                                      mem_relaxed);

                                    m_tail.compare_exchange_strong(
                                      transient_tail, future_tail, mem_relaxed);

                                    auto const user_storage = address_upper_align(
                                      address_add(new_control, overhead), i_alignment);
                                    DENSITY_ASSUME(
                                      reinterpret_cast<uintptr_t>(user_storage) + i_size <=
                                      future_tail);
                                    return Allocation{
                                      new_control, future_tail + i_control_bits, user_storage};
                                }
                                else
                                {
                                    if (guarantee == LfQueue_WaitFree)
                                    {
                                        return Allocation{};
                                    }
                                }
                            }
                            else
                            {
                                tail = page_overflow(guarantee, tail);

                                if (guarantee != LfQueue_Throwing)
                                {
                                    if (tail == 0)
                                    {
                                        return Allocation{};
                                    }
                                }
                                else
                                {
                                    DENSITY_ASSUME(tail != 0);
                                }
                            }
                        }
                        else
                        {
                            // the memory protection currently used (pinning) is based on an atomic increment, that is not wait-free
                            if (guarantee == LfQueue_WaitFree)
                            {
                                return Allocation{};
                            }

                            // an allocation is in progress, we help it
                            auto const clean_tail = tail - rest;
                            auto const incomplete_control =
                              reinterpret_cast<ControlBlock *>(clean_tail);
                            auto const next = clean_tail + rest * s_alloc_granularity;

                            auto const pin_result = scoped_pin.pin(incomplete_control);
                            if (pin_result != AlreadyPinned)
                            {
                                if (pin_result == PinFailed)
                                {
                                    return Allocation{};
                                }
                                auto updated_tail = m_tail.load(mem_relaxed);
                                if (updated_tail != tail)
                                {
                                    tail = updated_tail;
                                    continue;
                                }
                            }

                            // Note: NEEDS ZEROED-PAGES
                            uintptr_t expected_next = 0;
                            raw_atomic_compare_exchange_weak(
                              &incomplete_control->m_next,
                              &expected_next,
                              uintptr_t(next + LfQueue_Busy),
                              mem_relaxed);
                            if (m_tail.compare_exchange_weak(tail, next, mem_relaxed))
                            {
                                tail = next;
                            }
                        }
                    }
                }
                else
                {
                    // legacy heap allocations can only be blocking
                    if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                        return Allocation{};

                    return Base::template external_allocate<PROGRESS_GUARANTEE>(
                      i_control_bits, i_size, i_alignment);
                }
            }